

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFileStoreTests::resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
          (resetBeforeAndAfterWithTestFileManager *this)

{
  FileStore *pFVar1;
  SessionID sessionID;
  allocator<char> local_344;
  allocator<char> local_343;
  allocator<char> local_342;
  allocator<char> local_341;
  string local_340 [32];
  string local_320;
  STRING local_300;
  STRING local_2e0;
  STRING local_2c0;
  FieldBase local_2a0;
  FieldBase local_240;
  FieldBase local_1e0;
  SessionID local_180;
  
  resetBeforeAndAfterFileStoreFixture::resetBeforeAndAfterFileStoreFixture
            (&this->super_resetBeforeAndAfterFileStoreFixture);
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"FIX.4.2",&local_341);
  FIX::BeginString::BeginString((BeginString *)&local_2a0,&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"SETGET",&local_342);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_1e0,&local_2e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"TEST",&local_343);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_240,&local_300);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"Test",&local_344);
  FIX::SessionID::SessionID
            (&local_180,&local_2a0.m_string,&local_1e0.m_string,&local_240.m_string,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  FIX::FieldBase::~FieldBase(&local_240);
  std::__cxx11::string::~string((string *)&local_300);
  FIX::FieldBase::~FieldBase(&local_1e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  FIX::FieldBase::~FieldBase(&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  pFVar1 = (FileStore *)operator_new(0x130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_340,"store",(allocator<char> *)&local_2a0);
  FIX::FileStore::FileStore(pFVar1,local_340,&local_180);
  (this->super_resetBeforeAndAfterFileStoreFixture).super_fileStoreFixture.object =
       (MessageStore *)pFVar1;
  std::__cxx11::string::~string(local_340);
  FIX::SessionID::~SessionID(&local_180);
  return;
}

Assistant:

resetBeforeAndAfterWithTestFileManager() : resetBeforeAndAfterFileStoreFixture() {
    factory.destroy( object );

    SessionID sessionID( BeginString( "FIX.4.2" ),
        SenderCompID( "SETGET" ), TargetCompID( "TEST" ), "Test" );

    object = new FileStore( "store", sessionID);
  }